

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O3

UniquePtr<BIGNUM> __thiscall
anon_unknown.dwarf_4ec2e9::BIGNUMFileTest::GetBIGNUMImpl
          (BIGNUMFileTest *this,char *attribute,bool resize)

{
  FileTest *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  _Head_base<0UL,_bignum_st_*,_false> extraout_RAX;
  __uniq_ptr_impl<bignum_st,_bssl::internal::Deleter> extraout_RAX_00;
  tuple<bignum_st_*,_bssl::internal::Deleter> extraout_RAX_01;
  _Head_base<0UL,_bignum_st_*,_false> _Var4;
  char in_CL;
  undefined7 in_register_00000011;
  UniquePtr<BIGNUM> ret;
  string hex;
  BIGNUM *raw;
  _Head_base<0UL,_bignum_st_*,_false> local_70;
  string local_68;
  string local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  this_00 = *(FileTest **)attribute;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(char *)CONCAT71(in_register_00000011,resize),
             (allocator<char> *)&local_70);
  bVar1 = FileTest::GetAttribute(this_00,&local_68,&local_48);
  _Var4._M_head_impl = (bignum_st *)&local_48.field_2;
  if ((bignum_st *)local_48._M_dataplus._M_p != _Var4._M_head_impl) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var4._M_head_impl = extraout_RAX._M_head_impl;
  }
  if (!bVar1) {
    this->t_ = (FileTest *)0x0;
    goto LAB_002aa6a8;
  }
  local_70._M_head_impl = (bignum_st *)0x0;
  local_48._M_dataplus._M_p = (pointer)0x0;
  iVar2 = BN_hex2bn((BIGNUM **)&local_48,local_68._M_dataplus._M_p);
  local_70._M_head_impl = (bignum_st *)local_48._M_dataplus._M_p;
  if (iVar2 == (int)local_68._M_string_length) {
    if (in_CL != '\0') {
      uVar3 = *(uint *)(attribute + 0xc);
      if ((*(uint *)(attribute + 8) >> (uVar3 & 0x1f) & 1) != 0) {
        iVar2 = bn_resize_words((BIGNUM *)local_48._M_dataplus._M_p,
                                (long)(int)*(uint *)(local_48._M_dataplus._M_p + 8) * 2 + 1);
        if (iVar2 == 0) goto LAB_002aa697;
        uVar3 = *(uint *)(attribute + 0xc);
      }
      *(uint *)(attribute + 0xc) = uVar3 + 1;
    }
    this->t_ = (FileTest *)local_70._M_head_impl;
    local_70._M_head_impl = (bignum_st *)0x0;
  }
  else {
    FileTest::PrintLine(*(FileTest **)attribute,"Could not decode \'%s\'.",local_68._M_dataplus._M_p
                       );
LAB_002aa697:
    this->t_ = (FileTest *)0x0;
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_70);
  _Var4._M_head_impl =
       (bignum_st *)
       extraout_RAX_00._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
LAB_002aa6a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
    _Var4._M_head_impl =
         (bignum_st *)
         extraout_RAX_01.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
  }
  return (UniquePtr<BIGNUM>)_Var4._M_head_impl;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetBIGNUMImpl(const char *attribute, bool resize) {
    std::string hex;
    if (!t_->GetAttribute(&hex, attribute)) {
      return nullptr;
    }

    bssl::UniquePtr<BIGNUM> ret;
    if (HexToBIGNUM(&ret, hex.c_str()) != static_cast<int>(hex.size())) {
      t_->PrintLine("Could not decode '%s'.", hex.c_str());
      return nullptr;
    }
    if (resize) {
      // Test with an oversized |BIGNUM| if necessary.
      if ((large_mask_ & (1 << num_bignums_)) &&
          !bn_resize_words(ret.get(), ret->width * 2 + 1)) {
        return nullptr;
      }
      num_bignums_++;
    }
    return ret;
  }